

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_get_array_name(Integer g_a,char *array_name)

{
  size_t sVar1;
  
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot get array name on array that has not been allocated",0);
  }
  sVar1 = strlen(array_name);
  if (0x1f < sVar1) {
    pnga_error("Array name exceeds maximum array name length",0x1f);
  }
  strcpy(array_name,GA[g_a + 1000].name);
  return;
}

Assistant:

void pnga_get_array_name(Integer g_a, char *array_name)
{
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot get array name on array that has not been allocated",0);
  if (strlen(array_name) > FNAM)
    pnga_error("Array name exceeds maximum array name length",FNAM);
  strcpy(array_name, GA[ga_handle].name);
}